

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmlite_init.c
# Opt level: O1

int CRYPTO_init(void)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&_lock);
  uVar2 = 0;
  if (iVar1 == 0) {
    locked = 1;
    if (initialized == 0) {
      iVar1 = CRYPTO_alloc_init();
      if (iVar1 == 0) {
LAB_0010ba1d:
        abort();
      }
      iVar1 = sm2_group_init();
      if (iVar1 == 0) goto LAB_0010ba1d;
      iVar1 = sm9_group_init();
      if (iVar1 == 0) goto LAB_0010ba1d;
      iVar1 = sm9_pairing_init();
      if (iVar1 == 0) goto LAB_0010ba1d;
      _runtime_get_cpu_features();
      runtime_choose_sm3_implementation();
      runtime_choose_rand_implementation();
      initialized = 1;
    }
    uVar2 = 0;
    if (locked != 0) {
      locked = 0;
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&_lock);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

int CRYPTO_init()
{
    if (CRYPTO_crit_enter() != 0) 
        return GML_ERROR; /* LCOV_EXCL_LINE */

    if (initialized != 0) {
        if (CRYPTO_crit_leave() != 0) 
            return GML_ERROR; /* LCOV_EXCL_LINE */
        return GML_OK;
    }

    if (init_globals() == GML_ERROR) 
        abort();

    _runtime_get_cpu_features();

    runtime_choose_best_implementation();

    initialized = 1;
    if (CRYPTO_crit_leave() != 0)
        return GML_ERROR; /* LCOV_EXCL_LINE */

    return GML_OK;
}